

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O3

Vec_Int_t * Acb_ObjCollectTfoVec(Acb_Ntk_t *p,Vec_Int_t *vObjs)

{
  uint uVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  int *piVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  
  if ((p->vFanouts).nSize < 1) {
    iVar2 = (p->vObjType).nCap;
    iVar6 = (p->vFanouts).nCap;
    if (iVar6 < iVar2) {
      pVVar3 = (p->vFanouts).pArray;
      if (pVVar3 == (Vec_Int_t *)0x0) {
        pVVar3 = (Vec_Int_t *)malloc((long)iVar2 << 4);
      }
      else {
        pVVar3 = (Vec_Int_t *)realloc(pVVar3,(long)iVar2 << 4);
        iVar6 = (p->vFanouts).nCap;
      }
      (p->vFanouts).pArray = pVVar3;
      memset(pVVar3 + iVar6,0,(long)(iVar2 - iVar6) << 4);
      (p->vFanouts).nCap = iVar2;
    }
    (p->vFanouts).nSize = iVar2;
    iVar2 = (p->vObjType).nSize;
    if (1 < iVar2) {
      lVar7 = 1;
      do {
        lVar5 = (long)iVar2;
        if (lVar5 <= lVar7) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                        ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
        }
        if ((p->vObjType).pArray[lVar7] != '\0') {
          Acb_ObjAddFaninFanout(p,(int)lVar7);
          iVar2 = (p->vObjType).nSize;
          lVar5 = (long)iVar2;
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < lVar5);
    }
  }
  (p->vArray1).nSize = 0;
  if ((p->vObjTrav).nSize < 1) {
    uVar1 = (p->vObjType).nCap;
    if ((p->vObjTrav).nCap < (int)uVar1) {
      piVar4 = (p->vObjTrav).pArray;
      if (piVar4 == (int *)0x0) {
        piVar4 = (int *)malloc((long)(int)uVar1 << 2);
      }
      else {
        piVar4 = (int *)realloc(piVar4,(long)(int)uVar1 << 2);
      }
      (p->vObjTrav).pArray = piVar4;
      if (piVar4 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (p->vObjTrav).nCap = uVar1;
    }
    if (0 < (int)uVar1) {
      memset((p->vObjTrav).pArray,0,(ulong)uVar1 * 4);
    }
    (p->vObjTrav).nSize = uVar1;
  }
  p->nObjTravs = p->nObjTravs + 1;
  if (0 < vObjs->nSize) {
    lVar7 = 0;
    do {
      Acb_ObjCollectTfo_rec(p,vObjs->pArray[lVar7],0);
      lVar7 = lVar7 + 1;
    } while (lVar7 < vObjs->nSize);
  }
  return &p->vArray1;
}

Assistant:

Vec_Int_t * Acb_ObjCollectTfoVec( Acb_Ntk_t * p, Vec_Int_t * vObjs )
{
    int i, iObj;
    if ( !Acb_NtkHasObjFanout(p) )
        Acb_NtkCreateFanout( p );
    Vec_IntClear( &p->vArray1 );
    Acb_NtkIncTravId( p );
    Vec_IntForEachEntry( vObjs, iObj, i )
        Acb_ObjCollectTfo_rec( p, iObj, 0 );
    return &p->vArray1;
}